

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O1

void __thiscall wabt::ExportModuleField::~ExportModuleField(ExportModuleField *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_ModuleFieldMixin<(wabt::ModuleFieldType)3>).super_ModuleField._vptr_ModuleField =
       (_func_int **)&PTR__ExportModuleField_001e1890;
  Var::~Var(&(this->export_).var);
  pcVar2 = (this->export_).name._M_dataplus._M_p;
  paVar1 = &(this->export_).name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0xb0);
  return;
}

Assistant:

explicit ExportModuleField(const Location& loc = Location())
      : ModuleFieldMixin<ModuleFieldType::Export>(loc) {}